

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyline.h
# Opt level: O0

Unique<Polyline<2L>_> __thiscall
anurbs::Polyline<2L>::load(Polyline<2L> *this,Model *model,Json *data)

{
  const_reference other;
  pointer pPVar1;
  size_type sVar2;
  Index IVar3;
  reference this_00;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_88;
  size_type local_78;
  Index i;
  allocator<char> local_59;
  key_type local_58;
  undefined1 local_38 [8];
  value_type points;
  Json *data_local;
  Model *model_local;
  Unique<anurbs::Polyline<2L>_> *result;
  
  points.m_value.number_integer._7_1_ = 0;
  new_<anurbs::Polyline<2l>>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"points",&local_59);
  other = nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::at(data,&local_58);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_38,other);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pPVar1 = std::unique_ptr<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>_>::
           operator->((unique_ptr<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>_>
                       *)this);
  sVar2 = nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_38);
  std::
  vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ::resize(&pPVar1->m_points,sVar2);
  for (local_78 = 0; sVar2 = local_78,
      IVar3 = length<nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        ((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_38), (long)sVar2 < IVar3; local_78 = local_78 + 1) {
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator[]((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_38,local_78);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_Matrix<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>(&local_88);
    pPVar1 = std::unique_ptr<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>_>::
             operator->((unique_ptr<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>_>
                         *)this);
    this_00 = std::
              vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ::operator[](&pPVar1->m_points,local_78);
    Eigen::Matrix<double,_1,_2,_1,_1,_2>::operator=
              (this_00,(Matrix<double,_1,_2,_1,_1,_2> *)&local_88);
  }
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_38);
  return (__uniq_ptr_data<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Polyline<2L>,_std::default_delete<anurbs::Polyline<2L>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Polyline<TDimension>> load(Model& model, const Json& data)
    {
        auto result = new_<Polyline<TDimension>>();

        // load Points
        {
            const auto points = data.at("points");

            result->m_points.resize(points.size());

            for (Index i = 0; i < length(points); i++) {
                result->m_points[i] = points[i];
            }
        }

        return result;
    }